

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswCore.c
# Opt level: O0

void Ssw_ReportOutputs(Aig_Man_t *pAig)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAig_local;
  
  for (local_1c = 0; iVar1 = Saig_ManPoNum(pAig), local_1c < iVar1; local_1c = local_1c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_1c);
    iVar1 = Saig_ManPoNum(pAig);
    iVar2 = Saig_ManConstrNum(pAig);
    if (local_1c < iVar1 - iVar2) {
      Abc_Print(1,"o");
    }
    else {
      Abc_Print(1,"c");
    }
    pAVar3 = Aig_ObjChild0(pAVar3);
    Ssw_ReportOneOutput(pAig,pAVar3);
  }
  Abc_Print(1,"\n");
  return;
}

Assistant:

void Ssw_ReportOutputs( Aig_Man_t * pAig )
{
    Aig_Obj_t * pObj;
    int i;
    Saig_ManForEachPo( pAig, pObj, i )
    {
        if ( i < Saig_ManPoNum(pAig)-Saig_ManConstrNum(pAig) )
            Abc_Print( 1, "o" );
        else
            Abc_Print( 1, "c" );
        Ssw_ReportOneOutput( pAig, Aig_ObjChild0(pObj) );
    }
    Abc_Print( 1, "\n" );
}